

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right,Option *opt)

{
  Layer *pLVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 in_stack_00000008;
  ParamDict pd;
  Layer *crop;
  int in_stack_fffffffffffff6cc;
  ParamDict *in_stack_fffffffffffff6d0;
  undefined1 local_928 [40];
  Allocator *in_stack_fffffffffffff700;
  
  pLVar1 = create_layer(in_stack_fffffffffffff6cc);
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff700);
  ParamDict::set((ParamDict *)local_928,0,in_R8D);
  ParamDict::set((ParamDict *)local_928,1,in_EDX);
  ParamDict::set((ParamDict *)local_928,2,0);
  ParamDict::set((ParamDict *)local_928,3,(*(int *)(in_RDI + 0x2c) - in_R8D) - in_R9D);
  ParamDict::set((ParamDict *)local_928,4,(*(int *)(in_RDI + 0x30) - in_EDX) - in_ECX);
  ParamDict::set((ParamDict *)local_928,5,-0xe9);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_928);
  (*pLVar1->_vptr_Layer[4])(pLVar1,in_stack_00000008);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_stack_00000008);
  (*pLVar1->_vptr_Layer[5])(pLVar1,in_stack_00000008);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(in_stack_fffffffffffff6d0);
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, const Option& opt)
{
    Layer* crop = create_layer(LayerType::Crop);

    ParamDict pd;
    pd.set(0, left);
    pd.set(1, top);
    pd.set(2, 0);
    pd.set(3, src.w - left - right);
    pd.set(4, src.h - top - bottom);
    pd.set(5, -233);

    crop->load_param(pd);

    crop->create_pipeline(opt);

    crop->forward(src, dst, opt);

    crop->destroy_pipeline(opt);

    delete crop;
}